

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_util.cc
# Opt level: O2

string * make_full_var_name_abi_cxx11_
                   (string *__return_storage_ptr__,char *module_name,char *var_name)

{
  int iVar1;
  char *pcVar2;
  string local_40;
  
  if (((module_name != (char *)0x0) && (iVar1 = streq(module_name,"GLOBAL"), iVar1 == 0)) &&
     (pcVar2 = strstr(var_name,"::"), pcVar2 == (char *)0x0)) {
    normalized_module_name_abi_cxx11_(__return_storage_ptr__,module_name);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  extract_module_name_abi_cxx11_(&local_40,var_name);
  iVar1 = streq("GLOBAL",local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  if (iVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,var_name,(allocator<char> *)&local_40);
  }
  else {
    extract_var_name_abi_cxx11_(__return_storage_ptr__,var_name);
  }
  return __return_storage_ptr__;
}

Assistant:

string make_full_var_name(const char* module_name, const char* var_name)
	{
	if ( ! module_name || streq(module_name, GLOBAL_MODULE_NAME) || strstr(var_name, "::") )
		{
		if ( streq(GLOBAL_MODULE_NAME, extract_module_name(var_name).c_str()) )
			return extract_var_name(var_name);

		return string(var_name);
		}

	string full_name = normalized_module_name(module_name);
	full_name += "::";
	full_name += var_name;

	return full_name;
	}